

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_dim_model.cpp
# Opt level: O0

void __thiscall
MODEL3D::three_dim_model::rotate_vector
          (three_dim_model *this,double cx,double cy,double angle,
          vector<GEO::point,_std::allocator<GEO::point>_> *subject)

{
  anon_class_16_2_f9f0493a __f;
  anon_class_16_2_94731e59 __f_00;
  anon_class_16_2_f9f0493a __f_01;
  iterator iVar1;
  iterator iVar2;
  anon_class_16_2_f9f0493a translate_back;
  anon_class_16_2_94731e59 rotate_point;
  anon_class_16_2_f9f0493a revert_point_to_origin;
  double c;
  double s;
  vector<GEO::point,_std::allocator<GEO::point>_> *subject_local;
  double angle_local;
  double cy_local;
  double cx_local;
  three_dim_model *this_local;
  
  subject_local =
       (vector<GEO::point,_std::allocator<GEO::point>_> *)((angle * 3.141592653589793) / 180.0);
  s = (double)subject;
  angle_local = cy;
  cy_local = cx;
  cx_local = (double)this;
  c = sin((double)subject_local);
  revert_point_to_origin.cy = (double *)cos((double)subject_local);
  revert_point_to_origin.cx = &angle_local;
  iVar1 = std::vector<GEO::point,_std::allocator<GEO::point>_>::begin
                    ((vector<GEO::point,_std::allocator<GEO::point>_> *)s);
  iVar2 = std::vector<GEO::point,_std::allocator<GEO::point>_>::end
                    ((vector<GEO::point,_std::allocator<GEO::point>_> *)s);
  __f_01.cy = revert_point_to_origin.cx;
  __f_01.cx = &cy_local;
  std::
  for_each<__gnu_cxx::__normal_iterator<GEO::point*,std::vector<GEO::point,std::allocator<GEO::point>>>,MODEL3D::three_dim_model::rotate_vector(double,double,double,std::vector<GEO::point,std::allocator<GEO::point>>&)::__0>
            ((__normal_iterator<GEO::point_*,_std::vector<GEO::point,_std::allocator<GEO::point>_>_>
             )iVar1._M_current,
             (__normal_iterator<GEO::point_*,_std::vector<GEO::point,_std::allocator<GEO::point>_>_>
             )iVar2._M_current,__f_01);
  iVar1 = std::vector<GEO::point,_std::allocator<GEO::point>_>::begin
                    ((vector<GEO::point,_std::allocator<GEO::point>_> *)s);
  iVar2 = std::vector<GEO::point,_std::allocator<GEO::point>_>::end
                    ((vector<GEO::point,_std::allocator<GEO::point>_> *)s);
  __f_00.s = &c;
  __f_00.c = (double *)&revert_point_to_origin.cy;
  std::
  for_each<__gnu_cxx::__normal_iterator<GEO::point*,std::vector<GEO::point,std::allocator<GEO::point>>>,MODEL3D::three_dim_model::rotate_vector(double,double,double,std::vector<GEO::point,std::allocator<GEO::point>>&)::__1>
            ((__normal_iterator<GEO::point_*,_std::vector<GEO::point,_std::allocator<GEO::point>_>_>
             )iVar1._M_current,
             (__normal_iterator<GEO::point_*,_std::vector<GEO::point,_std::allocator<GEO::point>_>_>
             )iVar2._M_current,__f_00);
  iVar1 = std::vector<GEO::point,_std::allocator<GEO::point>_>::begin
                    ((vector<GEO::point,_std::allocator<GEO::point>_> *)s);
  iVar2 = std::vector<GEO::point,_std::allocator<GEO::point>_>::end
                    ((vector<GEO::point,_std::allocator<GEO::point>_> *)s);
  __f.cy = &angle_local;
  __f.cx = &cy_local;
  std::
  for_each<__gnu_cxx::__normal_iterator<GEO::point*,std::vector<GEO::point,std::allocator<GEO::point>>>,MODEL3D::three_dim_model::rotate_vector(double,double,double,std::vector<GEO::point,std::allocator<GEO::point>>&)::__2>
            ((__normal_iterator<GEO::point_*,_std::vector<GEO::point,_std::allocator<GEO::point>_>_>
             )iVar1._M_current,
             (__normal_iterator<GEO::point_*,_std::vector<GEO::point,_std::allocator<GEO::point>_>_>
             )iVar2._M_current,__f);
  return;
}

Assistant:

void MODEL3D::three_dim_model::rotate_vector(
double cx, double cy, double angle,
std::vector<GEO::point> &subject) // POINT &subject
{
  angle = (angle * PI) / ((double)180); // convert angle to radians
  double s = sin(angle);
  double c = cos(angle);
  auto revert_point_to_origin = [&cx, &cy](GEO::point &n) {
    n.x -= cx;
    n.y -= cy;
  };
  auto rotate_point = [&c, &s](GEO::point &n) {
    int n_x_orig = n.x;
    n.x = n.x * c - n.y * s;
    n.y = n_x_orig * s + n.y * c;
  };
  auto translate_back = [&cx, &cy](GEO::point &n) {
    n.x = n.x + cx;
    n.y = n.y + cy;
  };
  for_each(subject.begin(), subject.end(),
           revert_point_to_origin); // translate points back to origins
  for_each(subject.begin(), subject.end(), rotate_point); // rotate points
  for_each(subject.begin(), subject.end(),
           translate_back); // translate points back
}